

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManDerivePlacement(Emb_Man_t *p,int nSols)

{
  float *pArray;
  uint uVar1;
  float *pArray_00;
  ulong uVar2;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *puVar3;
  ulong uVar4;
  unsigned_short uVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  if (nSols != 2) {
    return;
  }
  pArray_00 = p->pSols;
  uVar1 = p->nObjs;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  fVar9 = -1e+09;
  fVar8 = 1e+09;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar7 = (int)pArray_00[uVar4];
    iVar6 = (int)fVar8;
    if (iVar7 <= (int)fVar8) {
      iVar6 = iVar7;
    }
    fVar8 = (float)iVar6;
    if (iVar7 < (int)fVar9) {
      iVar7 = (int)fVar9;
    }
    fVar9 = (float)iVar7;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pArray_00[uVar4] =
         (float)(-(uint)(pArray_00[uVar4] != 0.0) &
                (uint)((pArray_00[uVar4] - fVar8) * (32767.0 / (fVar9 - fVar8))));
  }
  pArray = pArray_00 + (int)uVar1;
  fVar9 = -1e+09;
  fVar8 = 1e+09;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar7 = (int)pArray[uVar4];
    iVar6 = (int)fVar8;
    if (iVar7 <= (int)fVar8) {
      iVar6 = iVar7;
    }
    fVar8 = (float)iVar6;
    if (iVar7 < (int)fVar9) {
      iVar7 = (int)fVar9;
    }
    fVar9 = (float)iVar7;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pArray[uVar4] =
         (float)(-(uint)(pArray[uVar4] != 0.0) &
                (uint)((pArray[uVar4] - fVar8) * (32767.0 / (fVar9 - fVar8))));
  }
  uVar4 = 0;
  __ptr = Gia_SortFloats(pArray_00,(int *)0x0,uVar1);
  __ptr_00 = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
  uVar1 = p->nObjs;
  puVar3 = (unsigned_short *)malloc((long)(int)uVar1 << 2);
  p->pPlacement = puVar3;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = (unsigned_short)(int)(((double)(int)uVar4 * 32767.0) / (double)(int)uVar1);
    puVar3[(long)__ptr[uVar4] * 2] = uVar5;
    puVar3[(long)__ptr_00[uVar4] * 2 + 1] = uVar5;
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void Emb_ManDerivePlacement( Emb_Man_t * p, int nSols )
{
    float * pY0, * pY1, Max0, Max1, Min0, Min1, Str0, Str1;
    int * pPerm0, * pPerm1;
    int k;
    if ( nSols != 2 )
        return;
    // compute intervals
    Min0 =  ABC_INFINITY;
    Max0 = -ABC_INFINITY;
    pY0 = Emb_ManSol( p, 0 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min0 = Abc_MinInt( Min0, pY0[k] );
        Max0 = Abc_MaxInt( Max0, pY0[k] );
    }
    Str0 = 1.0*GIA_PLACE_SIZE/(Max0 - Min0);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY0[k] = (pY0[k] != 0.0) ? ((pY0[k] - Min0) * Str0) : 0.0;

    // compute intervals
    Min1 =  ABC_INFINITY;
    Max1 = -ABC_INFINITY;
    pY1 = Emb_ManSol( p, 1 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min1 = Abc_MinInt( Min1, pY1[k] );
        Max1 = Abc_MaxInt( Max1, pY1[k] );
    }
    Str1 = 1.0*GIA_PLACE_SIZE/(Max1 - Min1);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY1[k] = (pY1[k] != 0.0) ? ((pY1[k] - Min1) * Str1) : 0.0;

    // derive the order of these numbers
    pPerm0 = Gia_SortFloats( pY0, NULL, p->nObjs );
    pPerm1 = Gia_SortFloats( pY1, NULL, p->nObjs );

    // average solutions and project them into square [0;GIA_PLACE_SIZE] x [0;GIA_PLACE_SIZE]
    p->pPlacement = ABC_ALLOC( unsigned short, 2 * p->nObjs );
    for ( k = 0; k < p->nObjs; k++ )
    {
        p->pPlacement[2*pPerm0[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        p->pPlacement[2*pPerm1[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
    }
    ABC_FREE( pPerm0 );
    ABC_FREE( pPerm1 );
}